

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O1

void __thiscall
pbrt::BinaryReader::read<pbrt::Texture>(BinaryReader *this,shared_ptr<pbrt::Texture> *t)

{
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  runtime_error *this_01;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  uVar1 = this->currentEntityOffset + 4;
  if (uVar1 <= (ulong)((long)(this->currentEntityData).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->currentEntityData).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
    this->currentEntityOffset = uVar1;
    getEntity<pbrt::Texture>((BinaryReader *)&stack0xffffffffffffffd8,(int)this);
    p_Var3 = p_Stack_20;
    peVar2 = local_28;
    local_28 = (element_type *)0x0;
    p_Stack_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = (t->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (t->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2;
    (t->super___shared_ptr<pbrt::Texture,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if (p_Stack_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_20);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_01,"invalid read attempt by entity - not enough data in data block!");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void read(std::shared_ptr<T> &t)
    {
      int32_t ID;
      read(ID);
      t = getEntity<T>(ID);
    }